

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<Qentem::QExpression>::operator+=(Array<Qentem::QExpression> *this,QExpression *item)

{
  SizeT SVar1;
  SizeT SVar2;
  QExpression *pQVar3;
  QExpression *value;
  QExpression *item_local;
  Array<Qentem::QExpression> *this_local;
  
  SVar1 = Size(this);
  SVar2 = Capacity(this);
  if (SVar1 == SVar2) {
    SVar1 = Capacity(this);
    SVar2 = Capacity(this);
    resize(this,(SVar1 | SVar2 == 0) << 1);
  }
  pQVar3 = Storage(this);
  SVar1 = Size(this);
  value = Memory::Move<Qentem::QExpression>(item);
  Memory::Initialize<Qentem::QExpression>(pQVar3 + SVar1,value);
  this->index_ = this->index_ + 1;
  return;
}

Assistant:

void operator+=(Type_T &&item) {
        if (Size() == Capacity()) {
            resize((Capacity() | (Capacity() == 0)) * SizeT{2});
        }

        Memory::Initialize((Storage() + Size()), Memory::Move(item));
        ++index_;
    }